

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O0

int id3_write_tag(file_t *outfile,char *album_title,char *artist,char *title,uint track_number,
                 char *comment)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char local_2168 [8];
  char tracknumber [256];
  uint local_2058;
  uint len;
  uint bytes_left;
  uint size;
  uchar *ptr;
  uchar id3 [8192];
  char *comment_local;
  uint track_number_local;
  char *title_local;
  char *artist_local;
  char *album_title_local;
  file_t *outfile_local;
  
  _bytes_left = id3 + 2;
  len = 0;
  local_2058 = 0x1ff6;
  if ((album_title != (char *)0x0) && (sVar3 = strlen(album_title), sVar3 != 0)) {
    len = id3_fill_tframe(_bytes_left,0x1ff6,"TAL",'\0',album_title);
    if (len == 0) {
      return 0;
    }
    local_2058 = 0x1ff6 - len;
    _bytes_left = _bytes_left + len;
  }
  if ((artist != (char *)0x0) && (sVar3 = strlen(artist), sVar3 != 0)) {
    uVar1 = id3_fill_tframe(_bytes_left,local_2058,"TP1",'\0',artist);
    if (uVar1 == 0) {
      return 0;
    }
    local_2058 = local_2058 - uVar1;
    _bytes_left = _bytes_left + uVar1;
    len = uVar1 + len;
  }
  if ((title != (char *)0x0) && (sVar3 = strlen(title), sVar3 != 0)) {
    uVar1 = id3_fill_tframe(_bytes_left,local_2058,"TT2",'\0',title);
    if (uVar1 == 0) {
      return 0;
    }
    local_2058 = local_2058 - uVar1;
    _bytes_left = _bytes_left + uVar1;
    len = uVar1 + len;
  }
  if (track_number != 0) {
    snprintf(local_2168,0x100,"%d");
    uVar1 = id3_fill_tframe(_bytes_left,local_2058,"TRK",'\0',local_2168);
    if (uVar1 == 0) {
      return 0;
    }
    local_2058 = local_2058 - uVar1;
    _bytes_left = _bytes_left + uVar1;
    len = uVar1 + len;
  }
  if ((comment != (char *)0x0) && (sVar3 = strlen(comment), sVar3 != 0)) {
    uVar1 = id3_fill_comment(_bytes_left,local_2058,'\0',(char *)0x0,comment,"eng");
    if (uVar1 == 0) {
      return 0;
    }
    len = uVar1 + len;
  }
  iVar2 = id3_fill_header((uchar *)&ptr,0x2000,(ulong)len);
  if (iVar2 == 0) {
    outfile_local._4_4_ = 0;
  }
  else {
    iVar2 = file_write(outfile,(uchar *)&ptr,(ulong)(len + 10));
    if (iVar2 == len + 10) {
      outfile_local._4_4_ = 1;
    }
    else {
      outfile_local._4_4_ = 0;
    }
  }
  return outfile_local._4_4_;
}

Assistant:

int id3_write_tag(file_t *outfile,
                  char *album_title,
                  char *artist,
                  char *title,
                  unsigned int track_number,
                  char *comment) {
  /* write id3 tags */
  unsigned char id3[ID3_TAG_SIZE];
  unsigned char *ptr = id3 + ID3_HEADER_SIZE;
  unsigned int size = 0, bytes_left = sizeof(id3) - ID3_HEADER_SIZE;
  unsigned int len;

  if (album_title && strlen(album_title) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TAL", 0, album_title);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (artist && strlen(artist) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TP1", 0, artist);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }
    
  if (title && strlen(title) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TT2", 0, title);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (track_number > 0) {
    char tracknumber[256];
    snprintf(tracknumber, 256, "%d", track_number);
    len = id3_fill_tframe(ptr, bytes_left, "TRK", 0, tracknumber);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (comment && strlen(comment) > 0) {
    len = id3_fill_comment(ptr, bytes_left, 0,
                           NULL,
                           comment,
                           "eng");
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (id3_fill_header(id3, sizeof(id3), size) == 0)
    return 0;

  len = file_write(outfile, id3, size + ID3_HEADER_SIZE);
  if (len != size + ID3_HEADER_SIZE)
    return 0;

  return 1;
}